

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O0

void __thiscall
OpenMPAlignedClause::generateDOT
          (OpenMPAlignedClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  bool bVar1;
  char *pcVar2;
  reference ppcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [8];
  string alignment_name;
  string alignment;
  allocator<char> local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_208;
  char **local_200;
  undefined1 local_1f8 [8];
  string expr_name;
  iterator iStack_1d0;
  int expr_index;
  iterator it;
  vector<const_char_*,_std::allocator<const_char_*>_> *expr;
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string clause_kind;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string indent;
  string current_line;
  string *parent_node_local;
  int index_local;
  int depth_local;
  ofstream *dot_file_local;
  OpenMPAlignedClause *this_local;
  
  std::__cxx11::string::string((string *)(indent.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,(long)depth,'\t',&local_69);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::to_string(&local_100,depth);
  std::operator+(&local_e0,"aligned_",&local_100);
  std::operator+(&local_c0,&local_e0,"_");
  std::__cxx11::to_string(&local_120,index);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&parameter_string.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 parent_node);
  std::operator+(&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&parameter_string.field_2 + 8),"-- ");
  std::operator+(&local_160,&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_140,&local_160,"\n");
  std::__cxx11::string::operator=((string *)(indent.field_2._M_local_buf + 8),(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)(parameter_string.field_2._M_local_buf + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar2);
  std::__cxx11::string::operator+=((string *)local_68,"\t");
  std::__cxx11::string::string((string *)&expr);
  it._M_current = (char **)OpenMPClause::getExpressions(&this->super_OpenMPClause);
  if ((vector<const_char_*,_std::allocator<const_char_*>_> *)it._M_current !=
      (vector<const_char_*,_std::allocator<const_char_*>_> *)0x0) {
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&stack0xfffffffffffffe30);
    expr_name.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)local_1f8);
    local_200 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   (it._M_current);
    iStack_1d0 = (iterator)local_200;
    while( true ) {
      local_208._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(it._M_current);
      bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffe30,&local_208);
      if (!bVar1) break;
      std::operator+(&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "_expr");
      std::__cxx11::to_string(&local_268,expr_name.field_2._12_4_);
      std::operator+(&local_228,&local_248,&local_268);
      std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_248);
      expr_name.field_2._12_4_ = expr_name.field_2._12_4_ + 1;
      std::operator+(&local_2e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(&local_2c8,&local_2e8," -- ");
      std::operator+(&local_2a8,&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
      ;
      std::operator+(&local_288,&local_2a8,"\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      std::operator+(&local_3c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "\t");
      std::operator+(&local_3a8,&local_3c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
      ;
      std::operator+(&local_388,&local_3a8," [label = \"");
      std::operator+(&local_368,&local_388,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
      ;
      std::operator+(&local_348,&local_368,"\\n ");
      ppcVar3 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&stack0xfffffffffffffe30);
      pcVar2 = *ppcVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,pcVar2,&local_3e9);
      std::operator+(&local_328,&local_348,&local_3e8);
      std::operator+(&local_308,&local_328,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator(&local_3e9);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&stack0xfffffffffffffe30,0);
    }
    std::__cxx11::string::~string((string *)local_1f8);
  }
  getUserDefinedAlignment_abi_cxx11_((string *)((long)&alignment_name.field_2 + 8),this);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&alignment_name.field_2 + 8),"");
  if (bVar1) {
    std::__cxx11::string::operator=
              ((string *)&expr,(string *)(alignment_name.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "_aligned_alignment");
    std::operator+(&local_4b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::operator+(&local_498,&local_4b8," -- ");
    std::operator+(&local_478,&local_498,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
    std::operator+(&local_458,&local_478,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+(&local_598,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "\t");
    std::operator+(&local_578,&local_598,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
    std::operator+(&local_558,&local_578," [label = \"");
    std::operator+(&local_538,&local_558,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
    std::operator+(&local_518,&local_538,"\\n ");
    std::operator+(&local_4f8,&local_518,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr);
    std::operator+(&local_4d8,&local_4f8,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_518);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::__cxx11::string::~string((string *)local_438);
  }
  std::__cxx11::string::~string((string *)(alignment_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&expr);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
  return;
}

Assistant:

void OpenMPAlignedClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "aligned_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    std::string parameter_string;

    std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };
    std::string alignment = this->getUserDefinedAlignment();
    if (alignment != "") {
        parameter_string = alignment;
        std::string alignment_name = clause_kind + "_aligned_alignment";
        current_line = indent + clause_kind + " -- " + alignment_name + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + alignment_name + " [label = \"" + alignment_name + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };    

}